

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall wasm::TranslateToFuzzReader::setupHeapTypes(TranslateToFuzzReader *this)

{
  Random *this_00;
  pointer *ppHVar1;
  pointer *ppHVar2;
  unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  *this_01;
  pointer *pppVar3;
  FeatureSet features;
  pointer pHVar4;
  iterator iVar5;
  pointer pHVar6;
  iterator iVar7;
  pointer poVar8;
  char cVar9;
  uint32_t uVar10;
  int iVar11;
  uint uVar12;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *types;
  long *plVar13;
  mapped_type *pmVar14;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar15;
  vector<wasm::HeapType,std::allocator<wasm::HeapType>> *pvVar16;
  long lVar17;
  vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>
  *this_02;
  ulong uVar18;
  long *plVar19;
  long lVar20;
  pointer pHVar21;
  char cVar22;
  char *pcVar23;
  uint uVar24;
  pointer puVar25;
  ulong uVar26;
  pointer pHVar27;
  bool bVar28;
  string_view sVar29;
  undefined1 auStack_288 [8];
  SubTypes subTypes;
  undefined1 local_100 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> possibleHeapTypes;
  pointer local_e0;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> inhabitable;
  string __str;
  HeapType type;
  HeapTypeGenerator generator;
  undefined1 local_58 [8];
  HeapType type_1;
  byte local_40;
  
  wasm::ModuleUtils::collectHeapTypes((Module *)local_100);
  HeapTypeGenerator::getInhabitable
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_288,
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_100);
  pHVar27 = (this->interestingHeapTypes).
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start;
  pHVar4 = (this->interestingHeapTypes).
           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->interestingHeapTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_288;
  (this->interestingHeapTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->interestingHeapTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  auStack_288 = (undefined1  [8])0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((pHVar27 != (pointer)0x0) &&
     (operator_delete(pHVar27,(long)pHVar4 - (long)pHVar27), auStack_288 != (undefined1  [8])0x0)) {
    operator_delete((void *)auStack_288,
                    (long)subTypes.types.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_288);
  }
  pvVar16 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&this->interestingHeapTypes;
  features.features = (this->wasm->features).features;
  if ((features.features >> 10 & 1) != 0) {
    this_00 = &this->random;
    uVar10 = Random::upTo(this_00,(this->fuzzParams->super_FuzzParams).MAX_NEW_GC_TYPES);
    HeapTypeGenerator::create((HeapTypeGenerator *)&type,this_00,features,(ulong)uVar10);
    wasm::TypeBuilder::build();
    if (local_40 == 1) {
      Fatal::Fatal((Fatal *)auStack_288);
      ppHVar1 = &subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppHVar1,"Failed to build heap types: ",0x1c);
      wasm::operator<<((ostream *)ppHVar1,(ErrorReason)type_1.id);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppHVar1," at index ",10);
      Fatal::operator<<((Fatal *)auStack_288,(unsigned_long *)local_58);
      Fatal::~Fatal((Fatal *)auStack_288);
    }
    types = std::
            get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                      ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                        *)local_58);
    HeapTypeGenerator::makeInhabitable
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&stack0xffffffffffffff20,
               types);
    pvVar15 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pvVar16;
    poVar8 = generator.supertypeIndices.
             super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    for (puVar25 = local_e0;
        generator.supertypeIndices.
        super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pvVar15,
        puVar25 !=
        (pointer)inhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_start; puVar25 = puVar25 + 1) {
      __str.field_2._8_8_ =
           (puVar25->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if ((Function *)0x7c < (ulong)__str.field_2._8_8_) {
        iVar5._M_current =
             (this->interestingHeapTypes).
             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->interestingHeapTypes).
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>
                    (pvVar16,iVar5,(HeapType *)((long)&__str.field_2 + 8));
        }
        else {
          (iVar5._M_current)->id = __str.field_2._8_8_;
          (this->interestingHeapTypes).
          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        uVar10 = Random::upTo(this_00,2);
        if (uVar10 == 0) {
          uVar26 = (long)(this->interestingHeapTypes).
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)(this->interestingHeapTypes).
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_start >> 3;
          cVar22 = '\x01';
          ppHVar1 = &subTypes.types.
                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          ppHVar2 = &inhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (9 < uVar26) {
            uVar18 = uVar26;
            cVar9 = '\x04';
            do {
              cVar22 = cVar9;
              if (uVar18 < 100) {
                cVar22 = cVar22 + -2;
                goto LAB_0013d553;
              }
              if (uVar18 < 1000) {
                cVar22 = cVar22 + -1;
                goto LAB_0013d553;
              }
              if (uVar18 < 10000) goto LAB_0013d553;
              bVar28 = 99999 < uVar18;
              uVar18 = uVar18 / 10000;
              cVar9 = cVar22 + '\x04';
            } while (bVar28);
            cVar22 = cVar22 + '\x01';
          }
LAB_0013d553:
          inhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)&__str._M_string_length;
          std::__cxx11::string::_M_construct((ulong)ppHVar2,cVar22);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)inhabitable.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (uint)__str._M_dataplus._M_p,uVar26);
          plVar13 = (long *)std::__cxx11::string::replace((ulong)ppHVar2,0,(char *)0x0,0x1d2ea0);
          plVar19 = plVar13 + 2;
          if ((pointer *)*plVar13 == (pointer *)plVar19) {
            subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar19;
            subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)plVar13[3];
            subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 *(undefined4 *)((long)plVar13 + 0x1c);
            auStack_288 = (undefined1  [8])ppHVar1;
          }
          else {
            subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar19;
            auStack_288 = (undefined1  [8])*plVar13;
          }
          subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)plVar13[1];
          *plVar13 = (long)plVar19;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          sVar29 = (string_view)
                   wasm::IString::interned
                             (subTypes.types.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_start,auStack_288,0);
          pmVar14 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->wasm->typeNames,(key_type *)((long)&__str.field_2 + 8));
          (pmVar14->name).super_IString.str = sVar29;
          if (auStack_288 != (undefined1  [8])ppHVar1) {
            operator_delete((void *)auStack_288,
                            (ulong)((long)&(subTypes.types.
                                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                            ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
          }
          pvVar16 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                    generator.supertypeIndices.
                    super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (inhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&__str._M_string_length)
          {
            operator_delete(inhabitable.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                            __str._M_string_length + 1);
          }
        }
      }
      pvVar15 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                generator.supertypeIndices.
                super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      poVar8 = generator.supertypeIndices.
               super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    generator.supertypeIndices.
    super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = poVar8;
    if (local_e0 != (pointer)0x0) {
      operator_delete(local_e0,(long)inhabitable.
                                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)local_e0);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr[local_40]._M_data)
              ((anon_class_1_0_00000001 *)auStack_288,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)local_58);
    if (generator.subtypeIndices.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(generator.subtypeIndices.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)generator.supertypeIndices.
                            super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)generator.subtypeIndices.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&generator);
    wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&type);
  }
  SubTypes::SubTypes((SubTypes *)auStack_288,
                     (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)pvVar16);
  pHVar27 = (this->interestingHeapTypes).
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start;
  pHVar4 = (this->interestingHeapTypes).
           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar27 != pHVar4) {
    this_01 = &this->interestingHeapSubTypes;
    possibleHeapTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&this->mutableArrays;
    generator.supertypeIndices.
    super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this->mutableStructFields;
    do {
      local_58 = (undefined1  [8])pHVar27->id;
      pvVar15 = SubTypes::getImmediateSubTypes((SubTypes *)auStack_288,(HeapType)local_58);
      pHVar6 = (pvVar15->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (pHVar21 = (pvVar15->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                     _M_impl.super__Vector_impl_data._M_start; pHVar21 != pHVar6;
          pHVar21 = pHVar21 + 1) {
        type.id = pHVar21->id;
        pvVar16 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                  std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,(key_type *)local_58);
        iVar5._M_current = *(HeapType **)(pvVar16 + 8);
        if (iVar5._M_current == *(HeapType **)(pvVar16 + 0x10)) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>(pvVar16,iVar5,&type);
        }
        else {
          (iVar5._M_current)->id = type.id;
          *(HeapType **)(pvVar16 + 8) = iVar5._M_current + 1;
        }
      }
      iVar11 = wasm::HeapType::getShared();
      bVar28 = iVar11 == 0;
      uVar12 = wasm::HeapType::getKind();
      if (4 < uVar12) goto LAB_0013da91;
      uVar26 = (ulong)((uint)bVar28 * 4);
      uVar18 = (ulong)((uint)bVar28 * 4 + 0x28);
      uVar24 = (uint)bVar28 * 4 + 0x20;
      switch(uVar12) {
      case 0:
        uVar12 = 0x209;
        pcVar23 = "unexpected kind";
        goto LAB_0013dc37;
      case 1:
        type.id = uVar26 | 0x10;
        pvVar16 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                  std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,&type);
        iVar5._M_current = *(HeapType **)(pvVar16 + 8);
        if (iVar5._M_current == *(HeapType **)(pvVar16 + 0x10)) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>(pvVar16,iVar5,(key_type *)local_58);
        }
        else {
          (iVar5._M_current)->id = (uintptr_t)local_58;
          *(HeapType **)(pvVar16 + 8) = iVar5._M_current + 1;
        }
        break;
      case 2:
        type.id = uVar26 | 0x38;
        pvVar16 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                  std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,&type);
        iVar5._M_current = *(HeapType **)(pvVar16 + 8);
        if (iVar5._M_current == *(HeapType **)(pvVar16 + 0x10)) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>(pvVar16,iVar5,(key_type *)local_58);
        }
        else {
          (iVar5._M_current)->id = (uintptr_t)local_58;
          *(HeapType **)(pvVar16 + 8) = iVar5._M_current + 1;
        }
        type.id = uVar18;
        pvVar16 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                  std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,&type);
        iVar5._M_current = *(HeapType **)(pvVar16 + 8);
        if (iVar5._M_current == *(HeapType **)(pvVar16 + 0x10)) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>(pvVar16,iVar5,(key_type *)local_58);
        }
        else {
          (iVar5._M_current)->id = (uintptr_t)local_58;
          *(HeapType **)(pvVar16 + 8) = iVar5._M_current + 1;
        }
        type.id = (uintptr_t)uVar24;
        pvVar16 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                  std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,&type);
        iVar5._M_current = *(HeapType **)(pvVar16 + 8);
        if (iVar5._M_current == *(HeapType **)(pvVar16 + 0x10)) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>(pvVar16,iVar5,(key_type *)local_58);
        }
        else {
          (iVar5._M_current)->id = (uintptr_t)local_58;
          *(HeapType **)(pvVar16 + 8) = iVar5._M_current + 1;
        }
        plVar13 = (long *)wasm::HeapType::getStruct();
        lVar17 = *plVar13;
        lVar20 = plVar13[1];
        if (lVar20 != lVar17) {
          uVar26 = 0;
          do {
            iVar11 = (int)uVar26;
            if (*(int *)(lVar17 + 0xc + uVar26 * 0x10) != 0) {
              type.id = (uintptr_t)local_58;
              iVar7._M_current =
                   (this->mutableStructFields).
                   super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              generator._0_4_ = iVar11;
              if (iVar7._M_current ==
                  (this->mutableStructFields).
                  super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>
                ::_M_realloc_insert<std::pair<wasm::HeapType,unsigned_int>>
                          ((vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>
                            *)generator.supertypeIndices.
                              super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar7,
                           (pair<wasm::HeapType,_unsigned_int> *)&type);
              }
              else {
                ((iVar7._M_current)->first).id = (uintptr_t)local_58;
                *(ulong *)&(iVar7._M_current)->second = CONCAT44(generator._4_4_,iVar11);
                pppVar3 = &(this->mutableStructFields).
                           super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *pppVar3 = *pppVar3 + 1;
              }
              lVar17 = *plVar13;
              lVar20 = plVar13[1];
            }
            uVar26 = (ulong)(iVar11 + 1);
          } while (uVar26 < (ulong)(lVar20 - lVar17 >> 4));
        }
        break;
      case 3:
        type.id = uVar26 | 0x40;
        pvVar16 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                  std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,&type);
        iVar5._M_current = *(HeapType **)(pvVar16 + 8);
        if (iVar5._M_current == *(HeapType **)(pvVar16 + 0x10)) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>(pvVar16,iVar5,(key_type *)local_58);
        }
        else {
          (iVar5._M_current)->id = (uintptr_t)local_58;
          *(HeapType **)(pvVar16 + 8) = iVar5._M_current + 1;
        }
        type.id = uVar18;
        pvVar16 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                  std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,&type);
        iVar5._M_current = *(HeapType **)(pvVar16 + 8);
        if (iVar5._M_current == *(HeapType **)(pvVar16 + 0x10)) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>(pvVar16,iVar5,(key_type *)local_58);
        }
        else {
          (iVar5._M_current)->id = (uintptr_t)local_58;
          *(HeapType **)(pvVar16 + 8) = iVar5._M_current + 1;
        }
        type.id = (uintptr_t)uVar24;
        pvVar16 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                  std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,&type);
        iVar5._M_current = *(HeapType **)(pvVar16 + 8);
        if (iVar5._M_current == *(HeapType **)(pvVar16 + 0x10)) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>(pvVar16,iVar5,(key_type *)local_58);
        }
        else {
          (iVar5._M_current)->id = (uintptr_t)local_58;
          *(HeapType **)(pvVar16 + 8) = iVar5._M_current + 1;
        }
        wasm::HeapType::getArray();
        if (generator._4_4_ != 0) {
          iVar5._M_current =
               (this->mutableArrays).
               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->mutableArrays).
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
            _M_realloc_insert<wasm::HeapType_const&>
                      ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                       possibleHeapTypes.
                       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,iVar5,(key_type *)local_58);
          }
          else {
            (iVar5._M_current)->id = (uintptr_t)local_58;
            (this->mutableArrays).
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
        }
        break;
      case 4:
        uVar12 = 0x207;
        pcVar23 = "TODO: cont";
LAB_0013dc37:
        wasm::handle_unreachable
                  (pcVar23,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,uVar12);
      }
LAB_0013da91:
      pHVar27 = pHVar27 + 1;
    } while (pHVar27 != pHVar4);
    pHVar27 = (this->interestingHeapTypes).
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_start;
    generator.supertypeIndices.
    super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->interestingHeapTypes).
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    if (pHVar27 !=
        (pointer)generator.supertypeIndices.
                 super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      do {
        local_58 = (undefined1  [8])pHVar27->id;
        iVar11 = wasm::HeapType::getKind();
        if (iVar11 == 2) {
          plVar13 = (long *)wasm::HeapType::getStruct();
          lVar17 = *plVar13;
          if (plVar13[1] != lVar17) {
            uVar26 = 0;
            do {
              this_02 = (vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>
                         *)std::__detail::
                           _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)&this->typeStructFields,
                                        (key_type *)(uVar26 * 0x10 + lVar17));
              type.id = (uintptr_t)local_58;
              iVar11 = (int)uVar26;
              iVar7._M_current = *(pair<wasm::HeapType,_unsigned_int> **)(this_02 + 8);
              generator._0_4_ = iVar11;
              if (iVar7._M_current == *(pair<wasm::HeapType,_unsigned_int> **)(this_02 + 0x10)) {
                std::
                vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>
                ::_M_realloc_insert<std::pair<wasm::HeapType,unsigned_int>>
                          (this_02,iVar7,(pair<wasm::HeapType,_unsigned_int> *)&type);
              }
              else {
                ((iVar7._M_current)->first).id = (uintptr_t)local_58;
                *(ulong *)&(iVar7._M_current)->second = CONCAT44(generator._4_4_,iVar11);
                *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 0x10;
              }
              uVar26 = (ulong)(iVar11 + 1);
              lVar17 = *plVar13;
            } while (uVar26 < (ulong)(plVar13[1] - lVar17 >> 4));
          }
        }
        else {
          iVar11 = wasm::HeapType::getKind();
          if (iVar11 == 3) {
            wasm::HeapType::getArray();
            pvVar16 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                      std::__detail::
                      _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this->typeArrays,(key_type *)&type);
            iVar5._M_current = *(HeapType **)(pvVar16 + 8);
            if (iVar5._M_current == *(HeapType **)(pvVar16 + 0x10)) {
              std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
              _M_realloc_insert<wasm::HeapType_const&>(pvVar16,iVar5,(HeapType *)local_58);
            }
            else {
              (iVar5._M_current)->id = (uintptr_t)local_58;
              *(HeapType **)(pvVar16 + 8) = iVar5._M_current + 1;
            }
          }
        }
        pHVar27 = pHVar27 + 1;
      } while (pHVar27 !=
               (pointer)generator.supertypeIndices.
                        super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&subTypes.types.
                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  if (auStack_288 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_288,
                    (long)subTypes.types.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_288);
  }
  if (local_100 != (undefined1  [8])0x0) {
    operator_delete((void *)local_100,
                    (long)possibleHeapTypes.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_100);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::setupHeapTypes() {
  // Start with any existing heap types in the module, which may exist in any
  // initial content we began with.
  auto possibleHeapTypes = ModuleUtils::collectHeapTypes(wasm);

  // Filter away uninhabitable heap types, that is, heap types that we cannot
  // construct, like a type with a non-nullable reference to itself.
  interestingHeapTypes = HeapTypeGenerator::getInhabitable(possibleHeapTypes);

  // For GC, also generate random types.
  if (wasm.features.hasGC()) {
    auto generator = HeapTypeGenerator::create(
      random, wasm.features, upTo(fuzzParams->MAX_NEW_GC_TYPES));
    auto result = generator.builder.build();
    if (auto* err = result.getError()) {
      Fatal() << "Failed to build heap types: " << err->reason << " at index "
              << err->index;
    }

    // Make the new types inhabitable. This process modifies existing types, so
    // it leaves more available compared to HeapTypeGenerator::getInhabitable.
    // We run that before on existing content, which may have instructions that
    // use the types, as editing them is not trivial, and for new types here we
    // are free to modify them so we keep as many as we can.
    auto inhabitable = HeapTypeGenerator::makeInhabitable(*result);
    for (auto type : inhabitable) {
      // Trivial types are already handled specifically in e.g.
      // getSingleConcreteType(), and we avoid adding them here as then we'd
      // need to add code to avoid uninhabitable combinations of them (like a
      // non-nullable bottom heap type).
      if (!type.isBottom() && !type.isBasic()) {
        interestingHeapTypes.push_back(type);
        if (oneIn(2)) {
          // Add a name for this type.
          wasm.typeNames[type].name =
            "generated_type$" + std::to_string(interestingHeapTypes.size());
        }
      }
    }
  }

  // Compute subtypes ahead of time. It is more efficient to do this all at once
  // now, rather than lazily later.
  SubTypes subTypes(interestingHeapTypes);
  for (auto type : interestingHeapTypes) {
    for (auto subType : subTypes.getImmediateSubTypes(type)) {
      interestingHeapSubTypes[type].push_back(subType);
    }
    // Basic types must be handled directly, since subTypes doesn't look at
    // those.
    auto share = type.getShared();
    auto struct_ = HeapTypes::struct_.getBasic(share);
    auto array = HeapTypes::array.getBasic(share);
    auto eq = HeapTypes::eq.getBasic(share);
    auto any = HeapTypes::any.getBasic(share);
    auto func = HeapTypes::func.getBasic(share);
    switch (type.getKind()) {
      case HeapTypeKind::Func:
        interestingHeapSubTypes[func].push_back(type);
        break;
      case HeapTypeKind::Struct: {
        interestingHeapSubTypes[struct_].push_back(type);
        interestingHeapSubTypes[eq].push_back(type);
        interestingHeapSubTypes[any].push_back(type);
        // Note the mutable fields.
        auto& fields = type.getStruct().fields;
        for (Index i = 0; i < fields.size(); i++) {
          if (fields[i].mutable_) {
            mutableStructFields.push_back(StructField{type, i});
          }
        }
        break;
      }
      case HeapTypeKind::Array:
        interestingHeapSubTypes[array].push_back(type);
        interestingHeapSubTypes[eq].push_back(type);
        interestingHeapSubTypes[any].push_back(type);
        if (type.getArray().element.mutable_) {
          mutableArrays.push_back(type);
        }
        break;
      case HeapTypeKind::Cont:
        WASM_UNREACHABLE("TODO: cont");
      case HeapTypeKind::Basic:
        WASM_UNREACHABLE("unexpected kind");
    }
  }

  // Compute struct and array fields.
  for (auto type : interestingHeapTypes) {
    if (type.isStruct()) {
      auto& fields = type.getStruct().fields;
      for (Index i = 0; i < fields.size(); i++) {
        typeStructFields[fields[i].type].push_back(StructField{type, i});
      }
    } else if (type.isArray()) {
      typeArrays[type.getArray().element.type].push_back(type);
    }
  }
}